

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_optional.pb.cc
# Opt level: O2

void proto2_unittest::TestProto3OptionalMessage_NestedMessage::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  anon_union_16_1_493b367e_for_TestProto3OptionalMessage_NestedMessage_3 *paVar1;
  uint uVar2;
  anon_union_16_1_493b367e_for_TestProto3OptionalMessage_NestedMessage_3 *paVar3;
  TestProto3OptionalMessage_NestedMessage *pTVar4;
  Nullable<const_char_*> failure_msg;
  Arena *pAVar5;
  string *value;
  TestProto3OptionalMessage_NestedMessage *_this;
  allocator<char> local_49;
  TestProto3OptionalMessage_NestedMessage *local_48;
  string local_40;
  
  local_48 = (TestProto3OptionalMessage_NestedMessage *)to_msg;
  local_40._M_dataplus._M_p = (pointer)from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto2_unittest::TestProto3OptionalMessage_NestedMessage_const*,proto2_unittest::TestProto3OptionalMessage_NestedMessage*>
                          ((TestProto3OptionalMessage_NestedMessage **)&local_40,&local_48,
                           "&from != _this");
  pTVar4 = local_48;
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    uVar2 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((uVar2 & 1) != 0) {
      value = (string *)(from_msg[1]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
      if (value->_M_string_length == 0) {
        if (((ulong)(local_48->field_0)._impl_.s_.tagged_ptr_.ptr_ & 3) == 0) {
          paVar3 = &local_48->field_0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_40,anon_var_dwarf_651463 + 5,&local_49);
          paVar1 = &pTVar4->field_0;
          *(byte *)paVar1 = *(byte *)paVar1 | 1;
          pAVar5 = (Arena *)(pTVar4->super_Message).super_MessageLite._internal_metadata_.ptr_;
          if (((ulong)pAVar5 & 1) != 0) {
            pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
          }
          google::protobuf::internal::ArenaStringPtr::Set<>(&(paVar3->_impl_).s_,&local_40,pAVar5);
          std::__cxx11::string::~string((string *)&local_40);
        }
      }
      else {
        *(byte *)&local_48->field_0 = *(byte *)&local_48->field_0 | 1;
        pAVar5 = (Arena *)(local_48->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar5 & 1) != 0) {
          pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  (&(local_48->field_0)._impl_.s_,value,pAVar5);
      }
    }
    (local_48->field_0)._impl_._has_bits_.has_bits_[0] =
         (local_48->field_0)._impl_._has_bits_.has_bits_[0] | uVar2;
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(local_48->super_Message).super_MessageLite._internal_metadata_,
               &from_msg->_internal_metadata_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_proto3_optional.pb.cc"
             ,0x612,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

void TestProto3OptionalMessage_NestedMessage::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestProto3OptionalMessage_NestedMessage*>(&to_msg);
  auto& from = static_cast<const TestProto3OptionalMessage_NestedMessage&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestProto3OptionalMessage.NestedMessage)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    if (!from._internal_s().empty()) {
      _this->_internal_set_s(from._internal_s());
    } else {
      if (_this->_impl_.s_.IsDefault()) {
        _this->_internal_set_s("");
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}